

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  FailureReporterInterface *pFVar1;
  _func_int **in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal *extraout_RDX_01;
  linked_ptr_internal lVar2;
  long *plVar3;
  void **this_00;
  Expectation EVar4;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  plVar3 = *(long **)((long)&(exp->source_text_).field_2 + 8);
  do {
    if (plVar3 == *(long **)&exp->cardinality_specified_) {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,"Cannot find expectation.","");
      pFVar1 = GetFailureReporter();
      (*pFVar1->_vptr_FailureReporterInterface[2])
                (pFVar1,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock-gtest-all.cc"
                 ,0x2a92,local_38);
      lVar2.next_ = extraout_RDX;
      if (local_38[0] != local_28) {
        operator_delete(local_38[0]);
        lVar2.next_ = extraout_RDX_00;
      }
      this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
      this->mock_obj_ = &this->mock_obj_;
LAB_0012bfff:
      EVar4.expectation_base_.link_.next_ = lVar2.next_;
      EVar4.expectation_base_.value_ = (ExpectationBase *)this;
      return (Expectation)EVar4.expectation_base_;
    }
    if ((_func_int **)*plVar3 == in_RDX) {
      this->_vptr_UntypedFunctionMockerBase = (_func_int **)*plVar3;
      this_00 = &this->mock_obj_;
      if (in_RDX == (_func_int **)0x0) {
        *this_00 = this_00;
        lVar2.next_ = (linked_ptr_internal *)0x0;
      }
      else {
        linked_ptr_internal::join
                  ((linked_ptr_internal *)this_00,(linked_ptr_internal *)(plVar3 + 1));
        lVar2.next_ = extraout_RDX_01;
      }
      goto LAB_0012bfff;
    }
    plVar3 = plVar3 + 2;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}